

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_int64_suite::fail_array32_int64_missing_four(void)

{
  undefined4 local_4c;
  value local_48 [2];
  undefined1 local_40 [8];
  decoder decoder;
  value_type input [9];
  
  stack0xffffffffffffffef = 0x33221100000008ce;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[9]>
            ((decoder *)local_40,(uchar (*) [9])((long)&decoder.current.view._M_str + 7));
  local_48[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_40);
  local_4c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xbab,"void compact_int64_suite::fail_array32_int64_missing_four()",local_48,&local_4c
            );
  return;
}

Assistant:

void fail_array32_int64_missing_four()
{
    const value_type input[] = { token::code::array32_int64, 0x08, 0x00, 0x00, 0x00, 0x11, 0x22, 0x33, 0x44 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}